

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

FSerializer * Serialize<PClass>(FSerializer *arc,char *key,PClass **clst,PClass **def)

{
  ushort uVar1;
  uint uVar2;
  FWriter *pFVar3;
  char cVar4;
  Value *this;
  Ch *cc;
  char *text;
  PClass *pPVar5;
  FName local_1c;
  
  pFVar3 = arc->w;
  if (pFVar3 == (FWriter *)0x0) {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      uVar1 = (this->data_).f.flags;
      if ((uVar1 >> 10 & 1) == 0) {
        if (uVar1 == 0) {
          *clst = (PClass *)0x0;
        }
        else {
          Printf("\x1cGstring type expected for \'%s\'",key);
          *clst = (PClass *)0x0;
          arc->mErrors = arc->mErrors + 1;
        }
      }
      else {
        cc = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this);
        text = UnicodeToString(cc);
        local_1c.Index = FName::NameManager::FindName(&FName::NameData,text,true);
        pPVar5 = PClass::FindClass(&local_1c);
        *clst = pPVar5;
      }
    }
  }
  else {
    uVar2 = (pFVar3->mInObject).Count;
    if (uVar2 == 0) {
      cVar4 = '\0';
    }
    else {
      cVar4 = (pFVar3->mInObject).Array[uVar2 - 1];
    }
    if (((def == (PClass **)0x0) || (cVar4 == '\0')) || (*clst != *def)) {
      FSerializer::WriteKey(arc,key);
      if (*clst == (PClass *)0x0) {
        FWriter::Null(arc->w);
      }
      else {
        FWriter::String(arc->w,FName::NameData.NameArray
                               [((*clst)->super_PNativeStruct).super_PStruct.super_PNamedType.
                                TypeName.Index].Text);
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, PClass *&clst, PClass **def)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || clst != *def)
		{
			arc.WriteKey(key);
			if (clst == nullptr)
			{
				arc.w->Null();
			}
			else
			{
				arc.w->String(clst->TypeName.GetChars());
			}
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsString())
			{
				clst = PClass::FindClass(UnicodeToString(val->GetString()));
			}
			else if (val->IsNull())
			{
				clst = nullptr;
			}
			else
			{
				Printf(TEXTCOLOR_RED "string type expected for '%s'", key);
				clst = nullptr;
				arc.mErrors++;
			}
		}
	}
	return arc;

}